

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_compression.cpp
# Opt level: O1

unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true> __thiscall
duckdb::DictionaryCompressionStorage::StringInitScan
          (DictionaryCompressionStorage *this,ColumnSegment *segment)

{
  BufferManager *pBVar1;
  CompressedStringScanState *pCVar2;
  pointer this_00;
  pointer *__ptr;
  templated_unique_single_t state;
  _Head_base<0UL,_duckdb::CompressedStringScanState_*,_false> local_48;
  BufferHandle local_40;
  
  pBVar1 = BufferManager::GetBufferManager(segment->db);
  (*pBVar1->_vptr_BufferManager[7])(&local_40,pBVar1,&segment->block);
  pCVar2 = (CompressedStringScanState *)operator_new(0xa8);
  (pCVar2->super_StringScanState).super_SegmentScanState._vptr_SegmentScanState = (_func_int **)0x0;
  (pCVar2->super_StringScanState).handle.handle.internal.
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (pCVar2->super_StringScanState).handle.handle.internal.
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pCVar2->super_StringScanState).handle.node.ptr = (FileBuffer *)0x0;
  (pCVar2->super_StringScanState).super_SegmentScanState._vptr_SegmentScanState =
       (_func_int **)&PTR__StringScanState_024aa978;
  BufferHandle::BufferHandle(&(pCVar2->super_StringScanState).handle);
  (pCVar2->super_StringScanState).super_SegmentScanState._vptr_SegmentScanState =
       (_func_int **)&PTR__CompressedStringScanState_024aa928;
  BufferHandle::BufferHandle(&pCVar2->owned_handle,&local_40);
  (pCVar2->handle).ptr = &pCVar2->owned_handle;
  (pCVar2->dictionary).internal.super___shared_ptr<duckdb::Vector,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (pCVar2->dictionary).internal.super___shared_ptr<duckdb::Vector,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pCVar2->sel_vec).internal.super___shared_ptr<duckdb::SelectionVector,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (pCVar2->sel_vec).internal.super___shared_ptr<duckdb::SelectionVector,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pCVar2->sel_vec_size = 0;
  local_48._M_head_impl = pCVar2;
  BufferHandle::~BufferHandle(&local_40);
  this_00 = unique_ptr<duckdb::CompressedStringScanState,_std::default_delete<duckdb::CompressedStringScanState>,_true>
            ::operator->((unique_ptr<duckdb::CompressedStringScanState,_std::default_delete<duckdb::CompressedStringScanState>,_true>
                          *)&local_48);
  CompressedStringScanState::Initialize(this_00,segment,true);
  *(CompressedStringScanState **)this = local_48._M_head_impl;
  return (unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>)
         (unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>)this;
}

Assistant:

unique_ptr<SegmentScanState> DictionaryCompressionStorage::StringInitScan(ColumnSegment &segment) {
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	auto state = make_uniq<CompressedStringScanState>(buffer_manager.Pin(segment.block));
	state->Initialize(segment, true);
	return std::move(state);
}